

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_timer.cpp
# Opt level: O1

void __thiscall lzham::lzham_timer::lzham_timer(lzham_timer *this)

{
  this->m_start_time = 0;
  this->m_stop_time = 0;
  this->field_0x10 = this->field_0x10 & 0xfc;
  if ((g_inv_freq == 0.0) && (!NAN(g_inv_freq))) {
    g_freq = 1000000;
    g_inv_freq = 9.999999974752427e-07;
    g_init_ticks = clock();
    return;
  }
  return;
}

Assistant:

lzham_timer::lzham_timer() :
      m_start_time(0),
      m_stop_time(0),
      m_started(false),
      m_stopped(false)
   {
      if (!g_inv_freq) 
         init();
   }